

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackTarCompressGenerator.cxx
# Opt level: O0

void __thiscall
cmCPackTarCompressGenerator::cmCPackTarCompressGenerator(cmCPackTarCompressGenerator *this)

{
  allocator local_31;
  string local_30;
  cmCPackTarCompressGenerator *local_10;
  cmCPackTarCompressGenerator *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"paxr",&local_31);
  cmCPackArchiveGenerator::cmCPackArchiveGenerator
            (&this->super_cmCPackArchiveGenerator,CompressCompress,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  (this->super_cmCPackArchiveGenerator).super_cmCPackGenerator.super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCPackTarCompressGenerator_00aefac8;
  return;
}

Assistant:

cmCPackTarCompressGenerator::cmCPackTarCompressGenerator()
  :cmCPackArchiveGenerator(cmArchiveWrite::CompressCompress,
                           "paxr")
{
}